

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall
ncnn::NetPrivate::forward_layer
          (NetPrivate *this,int layer_index,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *blob_mats
          ,Option *opt)

{
  Layer *layer;
  int iVar1;
  pointer piVar2;
  ulong uVar3;
  int unaff_EBP;
  bool bVar4;
  bool bVar5;
  
  layer = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
          super__Vector_impl_data._M_start[layer_index];
  if (layer->one_blob_only == false) {
    piVar2 = (layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    bVar5 = (layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish != piVar2;
    if (bVar5) {
      uVar3 = 0;
      do {
        bVar4 = true;
        if ((blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start[piVar2[uVar3]].dims == 0) {
          iVar1 = forward_layer(this,(this->blobs).
                                     super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                     _M_impl.super__Vector_impl_data._M_start[piVar2[uVar3]].
                                     producer,blob_mats,opt);
          bVar4 = iVar1 == 0;
          if (!bVar4) {
            unaff_EBP = iVar1;
          }
        }
        if (!bVar4) break;
        uVar3 = uVar3 + 1;
        piVar2 = (layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        bVar5 = uVar3 < (ulong)((long)(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)piVar2 >> 2
                               );
      } while (bVar5);
    }
    if (!bVar5) goto LAB_0018ae46;
  }
  else {
    iVar1 = *(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start[iVar1].dims == 0) {
      unaff_EBP = forward_layer(this,(this->blobs).
                                     super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                     _M_impl.super__Vector_impl_data._M_start[iVar1].producer,
                                blob_mats,opt);
      bVar5 = unaff_EBP == 0;
    }
    else {
      bVar5 = true;
    }
    if (bVar5) {
LAB_0018ae46:
      iVar1 = do_forward_layer(this,layer,blob_mats,opt);
      return iVar1;
    }
  }
  return unaff_EBP;
}

Assistant:

int NetPrivate::forward_layer(int layer_index, std::vector<Mat>& blob_mats, const Option& opt) const
{
    const Layer* layer = layers[layer_index];

    //     NCNN_LOGE("forward_layer %d %s", layer_index, layer->name.c_str());

    if (layer->one_blob_only)
    {
        // load bottom blob
        int bottom_blob_index = layer->bottoms[0];

        if (blob_mats[bottom_blob_index].dims == 0)
        {
            int ret = forward_layer(blobs[bottom_blob_index].producer, blob_mats, opt);
            if (ret != 0)
                return ret;
        }
    }
    else
    {
        // load bottom blobs
        for (size_t i = 0; i < layer->bottoms.size(); i++)
        {
            int bottom_blob_index = layer->bottoms[i];

            if (blob_mats[bottom_blob_index].dims == 0)
            {
                int ret = forward_layer(blobs[bottom_blob_index].producer, blob_mats, opt);
                if (ret != 0)
                    return ret;
            }
        }
    }

#if NCNN_BENCHMARK
    double start = get_current_time();
    Mat bottom_blob;
    if (layer->one_blob_only)
    {
        int bottom_blob_index = layer->bottoms[0];
        bottom_blob.dims = blob_mats[bottom_blob_index].dims;
        bottom_blob.w = blob_mats[bottom_blob_index].w;
        bottom_blob.h = blob_mats[bottom_blob_index].h;
        bottom_blob.c = blob_mats[bottom_blob_index].c;
        bottom_blob.elempack = blob_mats[bottom_blob_index].elempack;
        bottom_blob.elemsize = blob_mats[bottom_blob_index].elemsize;
    }
#endif
    int ret = do_forward_layer(layer, blob_mats, opt);
#if NCNN_BENCHMARK
    double end = get_current_time();
    if (layer->one_blob_only)
    {
        int top_blob_index = layer->tops[0];
        benchmark(layer, bottom_blob, blob_mats[top_blob_index], start, end);
    }
    else
    {
        benchmark(layer, start, end);
    }
#endif
    if (ret != 0)
        return ret;

    //     NCNN_LOGE("forward_layer %d %s done", layer_index, layer->name.c_str());
    //     const Mat& blob = blob_mats[layer->tops[0]];
    //     NCNN_LOGE("[%-2d %-16s %-16s]  %d    blobs count = %-3d   size = %-3d x %-3d", layer_index, layer->type.c_str(), layer->name.c_str(), layer->tops[0], blob.c, blob.h, blob.w);

    return 0;
}